

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uavs3d.c
# Opt level: O0

int uavs3d_output_frame(void *id,uavs3d_io_frm_t *frm,int flush,
                       uavs3d_lib_output_callback_t callback)

{
  com_pic_t *pcVar1;
  com_pic_t *pic;
  uavs3d_dec_t *ctx;
  uavs3d_lib_output_callback_t p_Stack_28;
  int ret;
  uavs3d_lib_output_callback_t callback_local;
  uavs3d_io_frm_t *puStack_18;
  int flush_local;
  uavs3d_io_frm_t *frm_local;
  void *id_local;
  
  ctx._4_4_ = 0;
  if (frm != (uavs3d_io_frm_t *)0x0) {
    frm->got_pic = 0;
  }
  if (*(int *)((long)id + 0x17cc) < 1) {
    ctx._4_4_ = -1;
  }
  else {
    p_Stack_28 = callback;
    callback_local._4_4_ = flush;
    puStack_18 = frm;
    frm_local = (uavs3d_io_frm_t *)id;
    pcVar1 = com_picman_out_pic((com_pic_manager_t *)((long)id + 0x1788),(int *)((long)&ctx + 4),
                                (u8)*(undefined4 *)((long)id + 0x17c8),flush);
    if ((pcVar1 != (com_pic_t *)0x0) && (puStack_18 != (uavs3d_io_frm_t *)0x0)) {
      puStack_18->num_plane = 2;
      puStack_18->bit_depth = pcVar1->bit_depth;
      puStack_18->buffer[0] = pcVar1->y;
      puStack_18->stride[0] = pcVar1->stride_luma;
      puStack_18->width[0] = pcVar1->width_luma;
      puStack_18->height[0] = pcVar1->height_luma;
      puStack_18->buffer[1] = pcVar1->uv;
      puStack_18->stride[1] = pcVar1->stride_chroma;
      puStack_18->width[1] = pcVar1->width_chroma;
      puStack_18->height[1] = pcVar1->height_chroma;
      puStack_18->ptr = pcVar1->ptr;
      puStack_18->pts = pcVar1->pts;
      puStack_18->dtr = (long)pcVar1->dtr;
      puStack_18->dts = pcVar1->dts;
      puStack_18->type = pcVar1->type;
      puStack_18->pkt_pos = pcVar1->pkt_pos;
      puStack_18->pkt_size = pcVar1->pkt_size;
      puStack_18->refpic_num[0] = pcVar1->refpic_num[0];
      puStack_18->refpic_num[1] = pcVar1->refpic_num[1];
      memcpy(puStack_18->refpic,pcVar1->refpic,0x100);
      puStack_18->seqhdr = (com_seqh_t *)((long)id + 8);
      puStack_18->got_pic = 1;
      *(int *)((long)id + 0x17cc) = *(int *)((long)id + 0x17cc) + -1;
      if (p_Stack_28 != (uavs3d_lib_output_callback_t)0x0) {
        (*p_Stack_28)(puStack_18);
      }
    }
  }
  return ctx._4_4_;
}

Assistant:

int uavs3d_output_frame(void *id, uavs3d_io_frm_t *frm, int flush, uavs3d_lib_output_callback_t callback) {
    int ret = 0;
    uavs3d_dec_t *ctx = id;

    if(frm) frm->got_pic = 0;

    if (ctx->output > 0) {
        com_pic_t *pic = com_picman_out_pic(&ctx->pic_manager, &ret, ctx->cur_decoded_doi, flush);

        if (pic && frm) {
            frm->num_plane = 2;
            frm->bit_depth = pic->bit_depth;

            frm->buffer[0] = pic->y;
            frm->stride[0] = pic->stride_luma * sizeof(pel);
            frm->width [0] = pic->width_luma;
            frm->height[0] = pic->height_luma;

            frm->buffer[1] = pic->uv;
            frm->stride[1] = pic->stride_chroma * sizeof(pel);
            frm->width [1] = pic->width_chroma;
            frm->height[1] = pic->height_chroma;

            frm->ptr  = pic->ptr;
            frm->pts  = pic->pts;
            frm->dtr  = pic->dtr;
            frm->dts  = pic->dts;
            frm->type = pic->type;

            frm->pkt_pos  = pic->pkt_pos;
            frm->pkt_size = pic->pkt_size;

            frm->refpic_num[0] = pic->refpic_num[0];
            frm->refpic_num[1] = pic->refpic_num[1];
            memcpy(frm->refpic, pic->refpic, 2 * 16 * sizeof(long long));

            frm->seqhdr = &ctx->seqhdr;
            frm->got_pic = 1;
            ctx->output--;

            if (callback) {
                callback(frm);
            }
        }
    } else {
        ret = -1;
    }

    return ret;
}